

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llog_message.cpp
# Opt level: O2

void __thiscall
ins::LLogMessage::LLogMessage(LLogMessage *this,string *file,string *function,int line,int level)

{
  long lVar1;
  tm *__tp;
  ostream *poVar2;
  id __id;
  basic_ostream<char,_std::char_traits<char>_> *pbVar3;
  string local_a0;
  time_t now_c;
  char time_str [64];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
  this->fatal_ = false;
  lVar1 = std::chrono::_V2::system_clock::now();
  now_c = lVar1 / 1000000000;
  __tp = localtime(&now_c);
  strftime(time_str,0x40,"%m-%d %T",__tp);
  poVar2 = std::operator<<((ostream *)this,'[');
  __id._M_thread = pthread_self();
  pbVar3 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)poVar2,__id);
  std::operator<<((ostream *)pbVar3,']');
  poVar2 = std::operator<<((ostream *)this,'[');
  std::operator<<(poVar2,_ZZN3ins11LLogMessageC1ERKNSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEES8_iiE17level_description_rel
                         + *(int *)(
                                   _ZZN3ins11LLogMessageC1ERKNSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEES8_iiE17level_description_rel
                                   + (long)level * 4));
  poVar2 = std::operator<<((ostream *)this,' ');
  poVar2 = std::operator<<(poVar2,time_str);
  poVar2 = std::operator<<(poVar2,'.');
  std::ostream::_M_insert<long>((long)poVar2);
  poVar2 = std::operator<<((ostream *)this,' ');
  ParseFileName(&local_a0,this,file);
  std::operator<<(poVar2,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  poVar2 = std::operator<<((ostream *)this,':');
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,line);
  std::operator<<(poVar2,']');
  return;
}

Assistant:

LLogMessage::LLogMessage(const std::string &file,
                         const std::string &function,
                         int line,
                         int level) {
  Ignore(function);
  static const char *level_description[] = {
    "VERBOSE",
    "INFO",
    "WARNING",
    "ERROR",
  };
  auto now = std::chrono::system_clock::now();
  auto log_time_ms = std::chrono::time_point_cast<std::chrono::milliseconds>(now);
  auto now_c = std::chrono::system_clock::to_time_t(log_time_ms);
  auto local_time = std::localtime(&now_c);
  char time_str[64];
  strftime(time_str, sizeof(time_str), "%m-%d %T", local_time);
  auto id = std::this_thread::get_id();
  oss_ << '[' << id << ']';
  oss_ << '[' << level_description[level];
  oss_ << ' ' << time_str << '.' << log_time_ms.time_since_epoch().count() % 1000;
  oss_ << ' ' << ParseFileName(file);
  oss_ << ':' << line << ']';
}